

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O1

int __thiscall CNetServer::Update(CNetServer *this)

{
  long lVar1;
  CNetBan *pCVar2;
  int iVar3;
  int64 iVar4;
  int64 iVar5;
  char *pReason;
  long lVar6;
  NETADDR_conflict *pNVar7;
  
  iVar4 = time_get();
  pNVar7 = &this->m_aSlots[0].m_Connection.m_PeerAddr;
  lVar6 = 0;
  do {
    if (((CNetConnection *)(pNVar7 + -0x59f))->m_State != 0) {
      CNetConnection::Update((CNetConnection *)(pNVar7 + -0x59f));
      if (((CNetConnection *)(pNVar7 + -0x59f))->m_State == 5) {
        lVar1 = *(long *)(pNVar7 + -0x47);
        iVar5 = time_freq();
        if ((iVar4 - lVar1 < iVar5) && (pCVar2 = this->m_pNetBan, pCVar2 != (CNetBan *)0x0)) {
          iVar3 = (*pCVar2->_vptr_CNetBan[2])(pCVar2,pNVar7,0x3c,"Stressing network");
          if (iVar3 != -1) goto LAB_0013cc57;
        }
        pReason = CNetConnection::ErrorString((CNetConnection *)(pNVar7 + -0x59f));
        Drop(this,(int)lVar6,pReason);
      }
    }
LAB_0013cc57:
    lVar6 = lVar6 + 1;
    pNVar7 = pNVar7 + 0x5a1;
    if (lVar6 == 0x40) {
      CNetTokenManager::Update(&this->m_TokenManager);
      CNetTokenCache::Update(&this->m_TokenCache);
      return 0;
    }
  } while( true );
}

Assistant:

int CNetServer::Update()
{
	int64 Now = time_get();
	for(int i = 0; i < NET_MAX_CLIENTS; i++)
	{
		if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
			continue;

		m_aSlots[i].m_Connection.Update();
		if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_ERROR)
		{
			if(Now - m_aSlots[i].m_Connection.ConnectTime() < time_freq() && NetBan())
			{
				if(NetBan()->BanAddr(ClientAddr(i), 60, "Stressing network") == -1)
					Drop(i, m_aSlots[i].m_Connection.ErrorString());
			}
			else
				Drop(i, m_aSlots[i].m_Connection.ErrorString());
		}
	}

	m_TokenManager.Update();
	m_TokenCache.Update();

	return 0;
}